

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

int clip_n_mmproj_embd(clip_ctx *ctx)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  mapped_type *pmVar3;
  runtime_error *this;
  string sStack_58;
  string proj_type;
  
  switch(ctx->proj_type) {
  case PROJECTOR_TYPE_MLP:
  case PROJECTOR_TYPE_PIXTRAL:
    pgVar2 = (ctx->vision_model).mm_2_b;
    break;
  case PROJECTOR_TYPE_MLP_NORM:
    pgVar2 = (ctx->vision_model).mm_3_b;
    break;
  case PROJECTOR_TYPE_LDP:
    pgVar2 = (ctx->vision_model).mm_model_block_1_block_2_1_b;
    break;
  case PROJECTOR_TYPE_LDPV2:
    pgVar2 = (ctx->vision_model).mm_model_peg_0_b;
    break;
  case PROJECTOR_TYPE_RESAMPLER:
    uVar1 = ctx->minicpmv_version - 2;
    if (uVar1 < 3) {
      return *(int *)(&DAT_00157d70 + (ulong)uVar1 * 4);
    }
  default:
    pmVar3 = std::
             map<projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<projector_type>,_std::allocator<std::pair<const_projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&PROJECTOR_TYPE_NAMES_abi_cxx11_,&ctx->proj_type);
    std::__cxx11::string::string((string *)&proj_type,(string *)pmVar3);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_
              (&sStack_58,"%s: don\'t support projector with: %s currently\n","clip_n_mmproj_embd",
               proj_type._M_dataplus._M_p);
    std::runtime_error::runtime_error(this,(string *)&sStack_58);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case PROJECTOR_TYPE_GLM_EDGE:
    pgVar2 = (ctx->vision_model).mm_model_mlp_3_w;
    goto LAB_00135303;
  case PROJECTOR_TYPE_MERGER:
    pgVar2 = (ctx->vision_model).mm_1_b;
    break;
  case PROJECTOR_TYPE_GEMMA3:
    pgVar2 = (ctx->vision_model).mm_input_proj_w;
    break;
  case PROJECTOR_TYPE_IDEFICS3:
    pgVar2 = (ctx->vision_model).projection;
LAB_00135303:
    return (int)pgVar2->ne[1];
  }
  return (int)pgVar2->ne[0];
}

Assistant:

int clip_n_mmproj_embd(const struct clip_ctx * ctx) {
    switch (ctx->proj_type) {
        case PROJECTOR_TYPE_LDP:
            return ctx->vision_model.mm_model_block_1_block_2_1_b->ne[0];
        case PROJECTOR_TYPE_LDPV2:
            return ctx->vision_model.mm_model_peg_0_b->ne[0];
        case PROJECTOR_TYPE_MLP:
        case PROJECTOR_TYPE_PIXTRAL:
            return ctx->vision_model.mm_2_b->ne[0];
        case PROJECTOR_TYPE_MLP_NORM:
            return ctx->vision_model.mm_3_b->ne[0];
        case PROJECTOR_TYPE_RESAMPLER:
            if (ctx->minicpmv_version == 2) {
                return 4096;
            } else if (ctx->minicpmv_version == 3) {
                return 3584;
            } else if (ctx->minicpmv_version == 4) {
                return 3584;
            }
            break; // Should not happen if version is valid
        case PROJECTOR_TYPE_GLM_EDGE:
            return ctx->vision_model.mm_model_mlp_3_w->ne[1];
        case PROJECTOR_TYPE_MERGER:
            return ctx->vision_model.mm_1_b->ne[0];
        case PROJECTOR_TYPE_GEMMA3:
            return ctx->vision_model.mm_input_proj_w->ne[0];
        case PROJECTOR_TYPE_IDEFICS3:
            return ctx->vision_model.projection->ne[1];
        default:
            break; // Fall through to throw
    }

    std::string proj_type = PROJECTOR_TYPE_NAMES[ctx->proj_type];
    throw std::runtime_error(string_format("%s: don't support projector with: %s currently\n", __func__, proj_type.c_str()));
}